

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

void write_delta_lflevel(AV1_COMMON *cm,MACROBLOCKD *xd,int lf_id,int delta_lflevel,
                        int delta_lf_multi,aom_writer *w)

{
  qm_val_t *pqVar1;
  byte bVar2;
  aom_writer *w_00;
  uint uVar3;
  aom_cdf_prob *cdf;
  undefined4 in_register_00000084;
  uint uVar4;
  
  w_00 = (aom_writer *)CONCAT44(in_register_00000084,delta_lf_multi);
  uVar4 = -lf_id;
  if (0 < lf_id) {
    uVar4 = lf_id;
  }
  uVar3 = 3;
  if (uVar4 < 3) {
    uVar3 = uVar4;
  }
  pqVar1 = (cm->quant_params).gqmatrix[5][2][3];
  cdf = (aom_cdf_prob *)(pqVar1 + (long)(int)xd * 10 + 0x3b10);
  if (delta_lflevel == 0) {
    cdf = (aom_cdf_prob *)(pqVar1 + 0x3b38);
  }
  aom_write_symbol((aom_writer *)CONCAT44(in_register_00000084,delta_lf_multi),uVar3,cdf,4);
  if (2 < uVar4) {
    uVar3 = 0x1f;
    if (uVar4 - 1 != 0) {
      for (; uVar4 - 1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    bVar2 = (byte)uVar3 & 0x1f;
    aom_write_literal(w_00,(uVar3 ^ 0xffffffe0) + 0x1f,3);
    aom_write_literal(w_00,(-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2) + uVar4,uVar3);
  }
  if (lf_id != 0) {
    aom_write_bit(w_00,(uint)lf_id >> 0x1f);
    return;
  }
  return;
}

Assistant:

static inline void write_delta_lflevel(const AV1_COMMON *cm,
                                       const MACROBLOCKD *xd, int lf_id,
                                       int delta_lflevel, int delta_lf_multi,
                                       aom_writer *w) {
  int sign = delta_lflevel < 0;
  int abs = sign ? -delta_lflevel : delta_lflevel;
  int rem_bits, thr;
  int smallval = abs < DELTA_LF_SMALL ? 1 : 0;
  FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
  (void)cm;

  if (delta_lf_multi) {
    assert(lf_id >= 0 && lf_id < (av1_num_planes(cm) > 1 ? FRAME_LF_COUNT
                                                         : FRAME_LF_COUNT - 2));
    aom_write_symbol(w, AOMMIN(abs, DELTA_LF_SMALL),
                     ec_ctx->delta_lf_multi_cdf[lf_id], DELTA_LF_PROBS + 1);
  } else {
    aom_write_symbol(w, AOMMIN(abs, DELTA_LF_SMALL), ec_ctx->delta_lf_cdf,
                     DELTA_LF_PROBS + 1);
  }

  if (!smallval) {
    rem_bits = get_msb(abs - 1);
    thr = (1 << rem_bits) + 1;
    aom_write_literal(w, rem_bits - 1, 3);
    aom_write_literal(w, abs - thr, rem_bits);
  }
  if (abs > 0) {
    aom_write_bit(w, sign);
  }
}